

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void readString(bool raw)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  int local_2c;
  char v_3;
  char v_2;
  char v_1;
  char v;
  int c;
  char *str;
  ulong uStack_18;
  bool multiline;
  size_t i;
  bool raw_local;
  
  lexerState->disableMacroArgs = true;
  lexerState->disableInterpolation = true;
  uStack_18 = 0;
  bVar2 = false;
  iVar3 = peek();
  if (iVar3 == 0x22) {
    shiftChar();
    iVar3 = peek();
    if (iVar3 != 0x22) goto LAB_001124c3;
    shiftChar();
    bVar2 = true;
  }
LAB_001121f5:
  local_2c = peek();
  if ((local_2c == -1) || ((!bVar2 && ((local_2c == 0xd || (local_2c == 10)))))) goto LAB_00112215;
  shiftChar();
  if ((local_2c == 0xd) || (local_2c == 10)) {
    handleCRLF(local_2c);
    nextLine();
    local_2c = 10;
  }
  if (local_2c == 0x22) {
    if (!bVar2) goto LAB_001124c3;
    iVar3 = peek();
    if (iVar3 == 0x22) {
      shiftChar();
      iVar3 = peek();
      if (iVar3 == 0x22) {
        shiftChar();
        goto LAB_001124c3;
      }
      if (uStack_18 < 0x100) {
        yylval.symName[uStack_18] = '\"';
        uStack_18 = uStack_18 + 1;
      }
    }
  }
  else {
    if (local_2c != 0x5c) {
      if ((local_2c != 0x7b) || (raw)) goto LAB_0011248c;
      lexerState->disableMacroArgs = false;
      _v_3 = readInterpolation(0);
      if (_v_3 != (char *)0x0) {
        while (*_v_3 != '\0') {
          pcVar4 = _v_3 + 1;
          cVar1 = *_v_3;
          _v_3 = pcVar4;
          if (uStack_18 < 0x100) {
            yylval.symName[uStack_18] = cVar1;
            uStack_18 = uStack_18 + 1;
          }
        }
      }
      lexerState->disableMacroArgs = true;
      goto LAB_001121f5;
    }
    if (!raw) {
      local_2c = peek();
      switch(local_2c) {
      default:
        pcVar4 = printChar(local_2c);
        error("Illegal character escape %s\n",pcVar4);
        shiftChar();
        break;
      case 10:
      case 0xd:
      case 0x20:
        readLineContinuation();
        goto LAB_001121f5;
      case 0x22:
      case 0x5c:
      case 0x7b:
      case 0x7d:
        shiftChar();
        break;
      case 0x23:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3c:
      case 0x40:
        shiftChar();
        _v_3 = readMacroArg((char)local_2c);
        if (_v_3 != (char *)0x0) {
          while (*_v_3 != '\0') {
            pcVar4 = _v_3 + 1;
            cVar1 = *_v_3;
            _v_3 = pcVar4;
            if (uStack_18 < 0x100) {
              yylval.symName[uStack_18] = cVar1;
              uStack_18 = uStack_18 + 1;
            }
          }
        }
        goto LAB_001121f5;
      case 0x6e:
        local_2c = 10;
        shiftChar();
        break;
      case 0x72:
        local_2c = 0xd;
        shiftChar();
        break;
      case 0x74:
        local_2c = 9;
        shiftChar();
        break;
      case -1:
        error("Illegal character escape at end of input\n");
        local_2c = 0x5c;
      }
    }
  }
LAB_0011248c:
  if (uStack_18 < 0x100) {
    yylval.symName[uStack_18] = (char)local_2c;
    uStack_18 = uStack_18 + 1;
  }
  goto LAB_001121f5;
LAB_00112215:
  error("Unterminated string\n");
LAB_001124c3:
  if (uStack_18 == 0x100) {
    uStack_18 = 0xff;
    warning(WARNING_LONG_STR,"String constant too long\n");
  }
  yylval.symName[uStack_18] = '\0';
  lexerState->disableMacroArgs = false;
  lexerState->disableInterpolation = false;
  return;
}

Assistant:

static void readString(bool raw)
{
	lexerState->disableMacroArgs = true;
	lexerState->disableInterpolation = true;

	size_t i = 0;
	bool multiline = false;
	char const *str;

	// We reach this function after reading a single quote, but we also support triple quotes
	if (peek() == '"') {
		shiftChar();
		if (peek() == '"') {
			// """ begins a multi-line string
			shiftChar();
			multiline = true;
		} else {
			// "" is an empty string, skip the loop
			goto finish;
		}
	}

	for (;;) {
		int c = peek();

		// '\r', '\n' or EOF ends a single-line string early
		if (c == EOF || (!multiline && (c == '\r' || c == '\n'))) {
			error("Unterminated string\n");
			break;
		}

		// We'll be staying in the string, so we can safely consume the char
		shiftChar();

		// Handle '\r' or '\n' (in multiline strings only, already handled above otherwise)
		if (c == '\r' || c == '\n') {
			// Handle CRLF before nextLine() since shiftChar updates colNo
			handleCRLF(c);
			nextLine();
			c = '\n';
		}

		switch (c) {
		case '"':
			if (multiline) {
				// Only """ ends a multi-line string
				if (peek() != '"')
					break;
				shiftChar();
				if (peek() != '"') {
					append_yylval_string('"');
					break;
				}
				shiftChar();
			}
			goto finish;

		case '\\': // Character escape or macro arg
			if (raw)
				break;
			c = peek();
			switch (c) {
			case '\\':
			case '"':
			case '{':
			case '}':
				// Return that character unchanged
				shiftChar();
				break;
			case 'n':
				c = '\n';
				shiftChar();
				break;
			case 'r':
				c = '\r';
				shiftChar();
				break;
			case 't':
				c = '\t';
				shiftChar();
				break;

			// Line continuation
			case ' ':
			case '\r':
			case '\n':
				readLineContinuation();
				continue;

			// Macro arg
			case '@':
			case '#':
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
			case '<':
				shiftChar();
				str = readMacroArg(c);
				if (str) {
					while (*str)
						append_yylval_string(*str++);
				}
				continue; // Do not copy an additional character

			case EOF: // Can't really print that one
				error("Illegal character escape at end of input\n");
				c = '\\';
				break;

			default:
				error("Illegal character escape %s\n", printChar(c));
				shiftChar();
				break;
			}
			break;

		case '{': // Symbol interpolation
			if (raw)
				break;
			// We'll be exiting the string scope, so re-enable expansions
			// (Not interpolations, since they're handled by the function itself...)
			lexerState->disableMacroArgs = false;
			str = readInterpolation(0);
			if (str) {
				while (*str)
					append_yylval_string(*str++);
			}
			lexerState->disableMacroArgs = true;
			continue; // Do not copy an additional character

		// Regular characters will just get copied
		}

		append_yylval_string(c);
	}

finish:
	if (i == sizeof(yylval.string)) {
		i--;
		warning(WARNING_LONG_STR, "String constant too long\n");
	}
	yylval.string[i] = '\0';

	lexerState->disableMacroArgs = false;
	lexerState->disableInterpolation = false;
}